

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O1

Am_Constraint * __thiscall
Web_Constraint::Create(Web_Constraint *this,Am_Slot *param_1,Am_Slot *new_slot)

{
  Am_Web_Create_Proc *pAVar1;
  Am_Web_Data *pAVar2;
  bool bVar3;
  Am_Web_Data *pAVar4;
  
  pAVar1 = this->owner->create_proc;
  if ((pAVar1 != (Am_Web_Create_Proc *)0x0) && (bVar3 = (*pAVar1)(new_slot), bVar3)) {
    pAVar4 = (Am_Web_Data *)operator_new(0x70);
    pAVar2 = this->owner;
    (pAVar4->interface).super_Am_Constraint.super_Am_Registered_Type._vptr_Am_Registered_Type =
         (_func_int **)&PTR_ID_002e3860;
    (pAVar4->interface).owner = pAVar4;
    pAVar4->create_proc = pAVar2->create_proc;
    pAVar4->initialize_proc = pAVar2->initialize_proc;
    pAVar4->validate_proc = pAVar2->validate_proc;
    pAVar4->prototype = pAVar2;
    pAVar4->child = (Am_Web_Data *)0x0;
    pAVar4->sibling = pAVar2->child;
    pAVar2->child = pAVar4;
    pAVar4->validating = false;
    pAVar4->initialized = false;
    pAVar4->valid = false;
    pAVar4->out_list = (Output_Port *)0x0;
    pAVar4->in_list = (Input_Port *)0x0;
    pAVar4->invalid_list = (Input_Port *)0x0;
    pAVar4->changed_first = (Input_Port *)0x0;
    pAVar4->changed_last = (Input_Port *)0x0;
    return &(pAVar4->interface).super_Am_Constraint;
  }
  return (Am_Constraint *)0x0;
}

Assistant:

Am_Constraint *
Web_Constraint::Create(const Am_Slot &, const Am_Slot &new_slot)
{
  if (owner->create_proc && owner->create_proc(new_slot))
    return *(new Am_Web_Data(owner));
  return nullptr;
}